

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetComputeProperties
          (ze_device_handle_t hDevice,ze_device_compute_properties_t *pComputeProperties)

{
  ze_pfnDeviceGetComputeProperties_t pfnGetComputeProperties;
  ze_result_t result;
  ze_device_compute_properties_t *pComputeProperties_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetComputeProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c230 != (code *)0x0) {
    pfnGetComputeProperties._4_4_ = (*DAT_0011c230)(hDevice,pComputeProperties);
  }
  return pfnGetComputeProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetComputeProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_device_compute_properties_t* pComputeProperties  ///< [in,out] query result for compute properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetComputeProperties = context.zeDdiTable.Device.pfnGetComputeProperties;
        if( nullptr != pfnGetComputeProperties )
        {
            result = pfnGetComputeProperties( hDevice, pComputeProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }